

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O3

fio_str_info_s *
fiobj_data_pread(fio_str_info_s *__return_storage_ptr__,FIOBJ io,intptr_t start_at,uintptr_t length)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  ulong uVar7;
  uintptr_t uVar8;
  long lVar9;
  long __offset;
  size_t __nbytes;
  stat stat;
  stat local_c0;
  
  if (io != 0) {
    do {
      if ((((io & 1) != 0) || (((uint)io & 6) == 6)) || (*(char *)(io & 0xfffffffffffffff8) != '+'))
      break;
      piVar3 = __errno_location();
      *piVar3 = 0;
      uVar4 = start_at >> 0x3f;
      if (*(int *)(io + 0x30) != -2) {
        if (*(int *)(io + 0x30) != -1) {
          goto LAB_00141475;
        }
        uVar1 = *(ulong *)(io + 0x20);
        uVar7 = (uVar4 & uVar1) + start_at;
        uVar4 = 0;
        if (0 < (long)uVar7) {
          uVar4 = uVar7;
        }
        if (uVar1 <= uVar4) {
          uVar4 = uVar1;
        }
        uVar8 = uVar1 - uVar4;
        if (uVar4 + length <= uVar1) {
          uVar8 = length;
        }
        if (uVar8 == 0) goto LAB_001413fd;
        __return_storage_ptr__->capa = 0;
        __return_storage_ptr__->len = uVar8;
        pcVar5 = (char *)(uVar4 + *(long *)(io + 8));
        goto LAB_0014150e;
      }
      uVar1 = *(ulong *)(io + 0x20);
      start_at = (uVar4 & uVar1) + start_at;
      if (start_at < 1) {
        start_at = 0;
      }
      if (uVar1 <= (ulong)start_at) {
        start_at = uVar1;
      }
      if (uVar1 < start_at + length) {
        length = uVar1 - start_at;
      }
      if (length == 0) goto LAB_001413fd;
      io = *(ulong *)(io + 0x10);
    } while (io != 0);
  }
  piVar3 = __errno_location();
  *piVar3 = 0xe;
  goto LAB_001413fd;
  while (*piVar3 == 4) {
LAB_00141475:
    iVar2 = fstat(*(int *)(io + 0x30),&local_c0);
    if (iVar2 == 0) goto LAB_0014149a;
  }
  local_c0.st_size = 0xffffffffffffffff;
LAB_0014149a:
  lVar9 = (uVar4 & local_c0.st_size) + start_at;
  __offset = 0;
  if (0 < lVar9) {
    __offset = lVar9;
  }
  __nbytes = local_c0.st_size - __offset;
  if (__offset + length <= (ulong)local_c0.st_size) {
    __nbytes = length;
  }
  if (__nbytes == 0) {
    *(undefined8 *)(io + 0x18) = 0;
    fio_free(*(void **)(io + 8));
    *(undefined8 *)(io + 8) = 0;
    __return_storage_ptr__->data = (char *)0x0;
    __return_storage_ptr__->capa = 0;
    __return_storage_ptr__->len = 0;
    return __return_storage_ptr__;
  }
  *(undefined8 *)(io + 0x20) = 0;
  *(undefined8 *)(io + 0x28) = 0;
  fiobj_data_pre_write(io,__nbytes + 1);
  sVar6 = pread(*(int *)(io + 0x30),*(void **)(io + 8),__nbytes,__offset);
  if (0 < (long)sVar6) {
    *(undefined1 *)(*(long *)(io + 8) + sVar6) = 0;
    __return_storage_ptr__->capa = 0;
    __return_storage_ptr__->len = sVar6;
    pcVar5 = *(char **)(io + 8);
LAB_0014150e:
    __return_storage_ptr__->data = pcVar5;
    return __return_storage_ptr__;
  }
LAB_001413fd:
  __return_storage_ptr__->capa = 0;
  __return_storage_ptr__->len = 0;
  __return_storage_ptr__->data = (char *)0x0;
  return __return_storage_ptr__;
}

Assistant:

fio_str_info_s fiobj_data_pread(FIOBJ io, intptr_t start_at, uintptr_t length) {
  if (!io || !FIOBJ_TYPE_IS(io, FIOBJ_T_DATA)) {
    errno = EFAULT;
    return (fio_str_info_s){
        .data = NULL,
        .len = 0,
    };
  }

  errno = 0;
  switch (obj2io(io)->fd) {
  case -1:
    return fiobj_data_pread_str(io, start_at, length);
    break;
  case -2:
    return fiobj_data_pread_slice(io, start_at, length);
    break;
  default:
    return fiobj_data_pread_file(io, start_at, length);
  }
}